

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_hash.c
# Opt level: O3

FIOBJ fiobj_hash_get(FIOBJ hash,FIOBJ key)

{
  FIOBJ FVar1;
  fiobj_object_vtable_s *pfVar2;
  fio_hash____map_s_ *pfVar3;
  code *in_RCX;
  uint uVar4;
  fio_hash___couplet_s obj;
  fio_str_info_s s;
  fio_str_info_s local_30;
  
  if (((uint)hash & 7) != 4) {
    __assert_fail("hash && FIOBJ_TYPE_IS(hash, FIOBJ_T_HASH)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fiobj/fiobj_hash.c"
                  ,0x12a,"FIOBJ fiobj_hash_get(const FIOBJ, FIOBJ)");
  }
  uVar4 = (uint)key;
  if ((uVar4 & 7) == 2) {
    FVar1 = fiobj_str_hash(key);
    goto LAB_001431b7;
  }
  FVar1 = key;
  if ((((uVar4 & 6) == 6) || (key == 0)) || (in_RCX = (code *)(ulong)(uVar4 & 1), (key & 1) != 0))
  goto LAB_001431b7;
  if ((key & 6) == 0) {
    switch(*(undefined1 *)(key & 0xfffffffffffffff8)) {
    case 0x27:
      pfVar2 = &FIOBJECT_VTABLE_FLOAT;
      break;
    case 0x28:
      goto switchD_00143179_caseD_28;
    case 0x29:
      pfVar2 = &FIOBJECT_VTABLE_ARRAY;
      break;
    case 0x2a:
      goto switchD_00143179_caseD_2a;
    case 0x2b:
      pfVar2 = &FIOBJECT_VTABLE_DATA;
      break;
    default:
      pfVar2 = &FIOBJECT_VTABLE_NUMBER;
    }
  }
  else if ((uVar4 & 6) == 2) {
switchD_00143179_caseD_28:
    pfVar2 = &FIOBJECT_VTABLE_STRING;
  }
  else {
switchD_00143179_caseD_2a:
    pfVar2 = &FIOBJECT_VTABLE_HASH;
  }
  (*pfVar2->to_str)(&local_30,key);
  in_RCX = fiobj_free_complex_object;
  FVar1 = fio_siphash13(local_30.data,local_30.len,0x1456f2,0x145bc9);
LAB_001431b7:
  obj.obj = (FIOBJ)in_RCX;
  obj.key = key;
  pfVar3 = fio_hash____find_map_pos_((fio_hash___s *)((hash & 0xfffffffffffffff8) + 8),FVar1,obj);
  if ((pfVar3 == (fio_hash____map_s_ *)0x0) || (pfVar3->pos == (fio_hash____ordered_s_ *)0x0)) {
    FVar1 = 0;
  }
  else {
    FVar1 = (pfVar3->pos->obj).obj;
  }
  return FVar1;
}

Assistant:

FIOBJ fiobj_hash_get(const FIOBJ hash, FIOBJ key) {
  assert(hash && FIOBJ_TYPE_IS(hash, FIOBJ_T_HASH));
  return fio_hash___find(&obj2hash(hash)->hash, fiobj_obj2hash(key), key);
  ;
}